

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glGetBooleanv(QOpenGLFunctions *this,GLenum pname,GLboolean *params)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0xb0))(in_ESI,in_RDX);
  return;
}

Assistant:

inline void QOpenGLFunctions::glGetBooleanv(GLenum pname, GLboolean* params)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glGetBooleanv(pname, params);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.GetBooleanv(pname, params);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}